

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_math.c
# Opt level: O3

double swap_mse(float *im1,float *im2,size_t w,size_t h,size_t X1,size_t Y1,size_t X2,size_t Y2)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  size_t sVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  sVar5 = w;
  if (X1 < w) {
    sVar5 = X1;
  }
  if (w <= X2) {
    X2 = w;
  }
  if (Y2 < h) {
    h = Y2;
  }
  dVar7 = 0.0;
  if (Y1 < h) {
    lVar2 = Y1 * w + sVar5;
    pfVar3 = im2 + lVar2;
    pfVar4 = im1 + lVar2;
    lVar2 = 0;
    do {
      if (X1 < X2) {
        lVar6 = 0;
        do {
          lVar1 = lVar2 + 1 + lVar6;
          auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar8._0_8_ = lVar1;
          auVar8._12_4_ = 0x45300000;
          dVar7 = ((double)(pfVar4[lVar6] - pfVar3[lVar6]) * (double)(pfVar4[lVar6] - pfVar3[lVar6])
                  - dVar7) /
                  ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) + dVar7;
          lVar6 = lVar6 + 1;
        } while (X2 - sVar5 != lVar6);
        lVar2 = lVar2 + (X2 - sVar5);
      }
      Y1 = Y1 + 1;
      pfVar3 = pfVar3 + w;
      pfVar4 = pfVar4 + w;
    } while (Y1 != h);
  }
  return dVar7;
}

Assistant:

double swap_mse(const float *im1, const float *im2, size_t w, size_t h,
                size_t X1, size_t Y1, size_t X2, size_t Y2) {
    double d, mse = 0;
    size_t i, j, n = 0;

    X1 = MIN(X1, w), Y1 = MIN(Y1, h), X2 = MIN(X2, w), Y2 = MIN(Y2, h);
    for (j = Y1; j < Y2; ++j)
        for (i = X1; i < X2; ++i) {
            ++n;
            d = im1[j * w + i] - im2[j * w + i];
            mse += (d * d - mse) / n;
        }

    return mse;
}